

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O3

bool __thiscall
helics::InputInfo::addSource
          (InputInfo *this,GlobalHandle newSource,string_view sourceName,string_view stype,
          string_view sunits)

{
  pointer *ppGVar1;
  size_type *psVar2;
  pointer pGVar3;
  pointer pGVar4;
  iterator __position;
  pointer pTVar5;
  iterator __position_00;
  pointer psVar6;
  size_t __len2;
  char *__s;
  long lVar7;
  pointer pGVar8;
  long lVar9;
  GlobalHandle local_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  value_type local_30;
  
  __len2 = sunits._M_len;
  __s = sunits._M_str;
  local_40._M_str = sourceName._M_str;
  local_40._M_len = sourceName._M_len;
  local_50._M_str = stype._M_str;
  local_50._M_len = stype._M_len;
  pGVar3 = (this->input_sources).
           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar4 = (this->input_sources).
           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_58 = newSource;
  if (pGVar3 != pGVar4) {
    lVar9 = 0x48;
    lVar7 = 0;
    do {
      if ((*(int *)((long)&(pGVar3->fed_id).gid + lVar7) == newSource.fed_id.gid.gid) &&
         (*(int *)((long)&(pGVar3->handle).hid + lVar7) == newSource.handle.hid.hid)) {
        pTVar5 = (this->deactivated).
                 super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(long *)((long)&pTVar5->internalTimeCode + lVar7) != 0x7fffffffffffffff) {
          *(undefined8 *)((long)&pTVar5->internalTimeCode + lVar7) = 0x7fffffffffffffff;
          psVar2 = (size_type *)
                   ((long)&(((this->source_info).
                             super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                             ._M_impl.super__Vector_impl_data._M_start)->key)._M_dataplus._M_p +
                   lVar9);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (psVar2 + -1),0,*psVar2,sunits._M_str,sunits._M_len);
          psVar6 = (this->source_info).
                   super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)psVar6 + lVar9 + -0x28),0,*(size_type *)((long)psVar6 + lVar9 + -0x20),
                     __s,__len2);
          return true;
        }
        return false;
      }
      lVar9 = lVar9 + 0x60;
      pGVar8 = (pointer)((long)&pGVar3[1].fed_id.gid + lVar7);
      lVar7 = lVar7 + 8;
    } while (pGVar8 != pGVar4);
  }
  (this->inputUnits)._M_string_length = 0;
  *(this->inputUnits)._M_dataplus._M_p = '\0';
  (this->inputType)._M_string_length = 0;
  *(this->inputType)._M_dataplus._M_p = '\0';
  __position._M_current =
       (this->input_sources).
       super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->input_sources).
      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
    _M_realloc_insert<helics::GlobalHandle_const&>
              ((vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>> *)
               &this->input_sources,__position,&local_58);
  }
  else {
    *__position._M_current = newSource;
    ppGVar1 = &(this->input_sources).
               super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  std::
  vector<helics::InputInfo::sourceInformation,std::allocator<helics::InputInfo::sourceInformation>>
  ::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<helics::InputInfo::sourceInformation,std::allocator<helics::InputInfo::sourceInformation>>
              *)&this->source_info,&local_40,&local_50,&sunits);
  std::
  vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
  ::resize(&this->data_queues,
           (long)(this->input_sources).
                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->input_sources).
                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
  ::resize(&this->current_data,
           (long)(this->input_sources).
                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->input_sources).
                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3);
  local_30.first.internalTimeCode = -0x7fffffffffffffff;
  local_30.second = 0;
  std::
  vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
  ::resize(&this->current_data_time,
           (long)(this->input_sources).
                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->input_sources).
                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3,&local_30);
  local_30.first.internalTimeCode = 0x7fffffffffffffff;
  __position_00._M_current =
       (this->deactivated).
       super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->deactivated).
      super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<TimeRepresentation<count_time<9,long>>,std::allocator<TimeRepresentation<count_time<9,long>>>>
    ::_M_realloc_insert<TimeRepresentation<count_time<9,long>>>
              ((vector<TimeRepresentation<count_time<9,long>>,std::allocator<TimeRepresentation<count_time<9,long>>>>
                *)&this->deactivated,__position_00,&local_30.first);
  }
  else {
    (__position_00._M_current)->internalTimeCode = 0x7fffffffffffffff;
    (this->deactivated).
    super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  this->has_target = true;
  return true;
}

Assistant:

bool InputInfo::addSource(GlobalHandle newSource,
                          std::string_view sourceName,
                          std::string_view stype,
                          std::string_view sunits)
{
    int index{0};
    for (const auto& is : input_sources) {
        if (is == newSource) {
            if (deactivated[index] < Time::maxVal()) {
                // this is a reconnection
                deactivated[index] = Time::maxVal();
                source_info[index].units = sunits;
                source_info[index].type = sunits;
                return true;
            }
            return false;
        }
        ++index;
    }
    // clear this since it isn't well defined what the units are once a new source is added
    inputUnits.clear();
    inputType.clear();
    input_sources.push_back(newSource);
    source_info.emplace_back(sourceName, stype, sunits);
    data_queues.resize(input_sources.size());
    current_data.resize(input_sources.size());
    current_data_time.resize(input_sources.size(), {Time::minVal(), 0});
    deactivated.push_back(Time::maxVal());
    has_target = true;
    return true;
}